

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O1

void ebur128_destroy(ebur128_state **st)

{
  ebur128_state_internal *peVar1;
  ebur128_dq_entry *peVar2;
  ebur128_dq_entry *peVar3;
  ebur128_state *st_00;
  
  free((*st)->d->short_term_block_energy_histogram);
  free((*st)->d->block_energy_histogram);
  free((*st)->d->v);
  free((*st)->d->audio_data);
  free((*st)->d->channel_map);
  free((*st)->d->sample_peak);
  free((*st)->d->prev_sample_peak);
  free((*st)->d->true_peak);
  free((*st)->d->prev_true_peak);
  peVar1 = (*st)->d;
  peVar2 = (peVar1->block_list).stqh_first;
  while (peVar2 != (ebur128_dq_entry *)0x0) {
    peVar3 = (peVar2->entries).stqe_next;
    (peVar1->block_list).stqh_first = peVar3;
    if (peVar3 == (ebur128_dq_entry *)0x0) {
      ((*st)->d->block_list).stqh_last = &((*st)->d->block_list).stqh_first;
    }
    free(peVar2);
    peVar1 = (*st)->d;
    peVar2 = (peVar1->block_list).stqh_first;
  }
  st_00 = *st;
  peVar1 = st_00->d;
  peVar2 = (peVar1->short_term_block_list).stqh_first;
  while (peVar2 != (ebur128_dq_entry *)0x0) {
    peVar3 = (peVar2->entries).stqe_next;
    (peVar1->short_term_block_list).stqh_first = peVar3;
    if (peVar3 == (ebur128_dq_entry *)0x0) {
      ((*st)->d->short_term_block_list).stqh_last = &((*st)->d->short_term_block_list).stqh_first;
    }
    free(peVar2);
    st_00 = *st;
    peVar1 = st_00->d;
    peVar2 = (peVar1->short_term_block_list).stqh_first;
  }
  ebur128_destroy_resampler(st_00);
  free((*st)->d);
  free(*st);
  *st = (ebur128_state *)0x0;
  return;
}

Assistant:

void ebur128_destroy(ebur128_state** st) {
  struct ebur128_dq_entry* entry;
  free((*st)->d->short_term_block_energy_histogram);
  free((*st)->d->block_energy_histogram);
  free((*st)->d->v);
  free((*st)->d->audio_data);
  free((*st)->d->channel_map);
  free((*st)->d->sample_peak);
  free((*st)->d->prev_sample_peak);
  free((*st)->d->true_peak);
  free((*st)->d->prev_true_peak);
  while (!STAILQ_EMPTY(&(*st)->d->block_list)) {
    entry = STAILQ_FIRST(&(*st)->d->block_list);
    STAILQ_REMOVE_HEAD(&(*st)->d->block_list, entries);
    free(entry);
  }
  while (!STAILQ_EMPTY(&(*st)->d->short_term_block_list)) {
    entry = STAILQ_FIRST(&(*st)->d->short_term_block_list);
    STAILQ_REMOVE_HEAD(&(*st)->d->short_term_block_list, entries);
    free(entry);
  }
  ebur128_destroy_resampler(*st);
  free((*st)->d);
  free(*st);
  *st = NULL;
}